

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.h
# Opt level: O2

void __thiscall
program_options::required_option::required_option(required_option *this,string *option_name)

{
  allocator<char> local_52;
  allocator<char> local_51;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"the option \'%canonical_option%\' is required but missing",
             &local_51);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_52);
  error_with_option_name::error_with_option_name
            (&this->super_error_with_option_name,&local_30,&local_50,option_name,0);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  *(undefined ***)&(this->super_error_with_option_name).super_error =
       &PTR__error_with_option_name_0017dc78;
  return;
}

Assistant:

required_option(const std::string& option_name)
   : error_with_option_name("the option '%canonical_option%' is required but missing", "", option_name)
   {
   }